

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O1

void __thiscall
duckdb::TopNBoundaryValue::UpdateValue(TopNBoundaryValue *this,string_t boundary_val)

{
  char (*__src) [4];
  bool bVar1;
  DynamicFilterData *this_00;
  undefined8 uVar2;
  OrderModifiers in_R9W;
  string_t sort_key;
  unique_lock<std::mutex> l;
  Value new_dynamic_value;
  anon_union_16_2_67f50693_for_value local_b8;
  unique_lock<std::mutex> local_a8;
  anon_union_16_2_67f50693_for_value local_98;
  undefined1 local_88 [48];
  Value local_58;
  
  local_b8.pointer.ptr = (char *)boundary_val.value._8_8_;
  local_b8._0_8_ = boundary_val.value._0_8_;
  local_a8._M_device = &this->lock;
  local_a8._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_a8);
  local_a8._M_owns = true;
  if (this->is_set == true) {
    __src = (char (*) [4])(this->boundary_value)._M_dataplus._M_p;
    local_98.pointer.length = (uint32_t)(this->boundary_value)._M_string_length;
    if (local_98.pointer.length < 0xd) {
      local_98._12_4_ = 0;
      local_98.pointer.prefix[0] = '\0';
      local_98.pointer.prefix[1] = '\0';
      local_98.pointer.prefix[2] = '\0';
      local_98.pointer.prefix[3] = '\0';
      local_98._8_4_ = 0;
      if (local_98.pointer.length != 0) {
        switchD_012e1ce8::default
                  (local_98.pointer.prefix,__src,(ulong)(local_98.pointer.length & 0xf));
      }
    }
    else {
      local_98.pointer.prefix = *__src;
      local_98._8_4_ = SUB84(__src,0);
      local_98._12_4_ = (undefined4)((ulong)__src >> 0x20);
    }
    bVar1 = string_t::StringComparisonOperators::GreaterThan
                      ((string_t *)&local_98.pointer,(string_t *)&local_b8.pointer);
    if (!bVar1) goto LAB_01583fac;
  }
  uVar2 = local_b8.pointer.ptr;
  if ((local_b8._0_8_ & 0xffffffff) < 0xd) {
    uVar2 = local_b8.pointer.prefix;
  }
  local_98._0_8_ = local_88;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,uVar2,(char *)(uVar2 + (local_b8._0_8_ & 0xffffffff)));
  ::std::__cxx11::string::operator=((string *)&this->boundary_value,(string *)&local_98.pointer);
  if ((undefined1 *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_);
  }
  this->is_set = true;
  if ((this->op->dynamic_filter).internal.
      super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    sort_key.value.pointer.ptr = (char *)&this->boundary_vector;
    sort_key.value._0_8_ = local_b8.pointer.ptr;
    CreateSortKeyHelpers::DecodeSortKey
              ((CreateSortKeyHelpers *)local_b8._0_8_,sort_key,(Vector *)0x0,
               (ulong)*(uint *)&this->boundary_modifiers,in_R9W);
    Vector::GetValue((Value *)&local_98.pointer,&this->boundary_vector,0);
    ::std::unique_lock<std::mutex>::unlock(&local_a8);
    this_00 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(&this->op->dynamic_filter);
    Value::Value(&local_58,(Value *)&local_98.pointer);
    DynamicFilterData::SetValue(this_00,&local_58);
    Value::~Value(&local_58);
    Value::~Value((Value *)&local_98.pointer);
  }
LAB_01583fac:
  ::std::unique_lock<std::mutex>::~unique_lock(&local_a8);
  return;
}

Assistant:

void UpdateValue(string_t boundary_val) {
		unique_lock<mutex> l(lock);
		if (!is_set || boundary_val < string_t(boundary_value)) {
			boundary_value = boundary_val.GetString();
			is_set = true;
			if (op.dynamic_filter) {
				CreateSortKeyHelpers::DecodeSortKey(boundary_val, boundary_vector, 0, boundary_modifiers);
				auto new_dynamic_value = boundary_vector.GetValue(0);
				l.unlock();
				op.dynamic_filter->SetValue(std::move(new_dynamic_value));
			}
		}
	}